

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MeshData *meshData;
  rep rVar5;
  duration<long,_std::ratio<1L,_1000000000L>_> local_450;
  duration<long,_std::ratio<1L,_1000L>_> local_448;
  rep local_440;
  FontColor local_438;
  undefined2 local_434;
  undefined1 local_432;
  allocator local_431;
  string local_430;
  undefined1 local_410 [8];
  Text fpsCounter;
  FontFace fontFace;
  FontColor darkBlue;
  Cube cube;
  Mesh mesh;
  string local_2f0;
  undefined1 local_2d0 [8];
  Texture houseTexture;
  MeshData *houseMesh;
  Triangle triangle;
  Image woodImage;
  string local_238;
  undefined1 local_214 [8];
  Texture woodTexture;
  Image grayBrickImage;
  string local_1d0;
  undefined1 local_1ac [8];
  Texture grayBrickTexture;
  shared_ptr<InputHandler> local_190;
  anon_class_16_2_c6a104b3 local_180;
  GamepadRawStateCallback local_170;
  undefined1 local_150 [8];
  GamepadInputHandler gamepad1;
  GamepadState lastGamepad1State;
  allocator local_91;
  string local_90;
  undefined1 local_70 [8];
  Application app;
  int height;
  int width;
  char **argv_local;
  int argc_local;
  
  printf("Application started!");
  puts("");
  fflush(_stdout);
  app._inputHandlers.
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x280;
  app._inputHandlers.
  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x1e0;
  Application::Application((Application *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"GLEX Graphics Example",&local_91);
  Application::createWindow
            ((Application *)local_70,&local_90,
             app._inputHandlers.
             super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
             (int)app._inputHandlers.
                  super__Vector_base<std::shared_ptr<InputHandler>,_std::allocator<std::shared_ptr<InputHandler>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  GamepadState::GamepadState((GamepadState *)((long)&gamepad1._gamepadName.field_2 + 0xc));
  GamepadInputHandler::GamepadInputHandler((GamepadInputHandler *)local_150,'\0');
  local_180.app = (Application *)local_70;
  local_180.lastGamepad1State = (GamepadState *)((long)&gamepad1._gamepadName.field_2 + 0xc);
  std::function<void(GamepadState)>::function<main::__0,void>
            ((function<void(GamepadState)> *)&local_170,&local_180);
  GamepadInputHandler::registerRawStateCallback((GamepadInputHandler *)local_150,&local_170);
  std::function<void_(GamepadState)>::~function(&local_170);
  std::shared_ptr<GamepadInputHandler>::shared_ptr<GamepadInputHandler,void>
            ((shared_ptr<GamepadInputHandler> *)&grayBrickTexture._width,
             (GamepadInputHandler *)local_150);
  std::shared_ptr<InputHandler>::shared_ptr<GamepadInputHandler,void>
            (&local_190,(shared_ptr<GamepadInputHandler> *)&grayBrickTexture._width);
  Application::addInputHandler((Application *)local_70,&local_190);
  std::shared_ptr<InputHandler>::~shared_ptr(&local_190);
  std::shared_ptr<GamepadInputHandler>::~shared_ptr
            ((shared_ptr<GamepadInputHandler> *)&grayBrickTexture._width);
  Texture::Texture((Texture *)local_1ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d0,"images/gray_brick_512.jpg",
             (allocator *)((long)&grayBrickImage.texture + 7));
  Texture::loadRGB((Texture *)local_1ac,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&grayBrickImage.texture + 7));
  iVar2 = Application::windowHeight((Application *)local_70);
  iVar3 = Application::windowWidth((Application *)local_70);
  iVar4 = Application::windowHeight((Application *)local_70);
  Image::Image((Image *)&woodTexture._width,(Texture *)local_1ac,0.0,(float)iVar2,-100.0,
               (float)iVar3,(float)iVar4,(float)local_70._0_4_,1.0);
  Texture::Texture((Texture *)local_214);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_238,"images/wood1.bmp",(allocator *)((long)&woodImage.texture + 7));
  Texture::loadRGB((Texture *)local_214,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator((allocator<char> *)((long)&woodImage.texture + 7));
  Image::Image((Image *)&triangle.rotationY,(Texture *)local_214,250.0,420.0,10.0,100.0,100.0,
               (float)local_70._0_4_,1.0);
  Triangle::Triangle((Triangle *)((long)&houseMesh + 4),250.0,220.0,10.0,100.0,100.0,
                     (float)local_70._0_4_,1.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&houseTexture._height,"meshes/house.obj",
             (allocator *)((long)&houseTexture._width + 3));
  meshData = MeshLoader::loadObjMesh((string *)&houseTexture._height);
  std::__cxx11::string::~string((string *)&houseTexture._height);
  std::allocator<char>::~allocator((allocator<char> *)((long)&houseTexture._width + 3));
  Texture::Texture((Texture *)local_2d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f0,"images/house_512.png",(allocator *)&mesh.field_0x27);
  Texture::loadRGBA((Texture *)local_2d0,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&mesh.field_0x27);
  Mesh::Mesh((Mesh *)&cube._anglez,meshData,(Texture *)local_2d0,0.3);
  Cube::Cube((Cube *)&fontFace);
  fpsCounter._206_1_ = 0x94;
  fpsCounter._204_2_ = 0x115;
  bVar1 = 1.0 < (float)local_70._0_4_;
  fpsCounter._texture._height = (uint)bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_430,"",&local_431);
  local_432 = fpsCounter._206_1_;
  local_434 = fpsCounter._204_2_;
  local_438.b = fpsCounter._206_1_;
  local_438.r = fpsCounter._204_1_;
  local_438.g = fpsCounter._205_1_;
  Text::Text((Text *)local_410,(uint)bVar1,&local_430,local_438,20.0,20.0,100.0,
             (float)local_70._0_4_,1.0,0.0);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator((allocator<char> *)&local_431);
  Text::createTexture((Text *)local_410);
  printf("\n\nPress L + R + Start to exit...");
  puts("");
  fflush(_stdout);
  while( true ) {
    iVar2 = Application::windowShouldClose((Application *)local_70);
    if (iVar2 != 0) break;
    nbFrames = nbFrames + 1;
    currentTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    local_440 = (rep)currentTime.__d.__r;
    local_450.__r = (rep)std::chrono::operator-(&currentTime,&lastTime);
    local_448.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        (&local_450);
    rVar5 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_448);
    timeDiff = (uint16_t)rVar5;
    if (999 < timeDiff) {
      frameTime = (float)timeDiff / (float)nbFrames;
      fps = nbFrames;
      nbFrames = 0;
      lastTime = currentTime;
    }
    Application::handleInput((Application *)local_70);
    Application::clear((Application *)local_70);
    Application::reshapeOrtho((Application *)local_70,1.0);
    Image::draw((Image *)&woodTexture._width);
    Application::reshapeFrustum((Application *)local_70);
    Mesh::draw((Mesh *)&cube._anglez);
    cube._anglez = cube._anglez + 0.75;
    cube._20_4_ = (float)cube._20_4_ + 0.75;
    mesh.rotationX = mesh.rotationX + 0.75;
    Application::reshapeOrtho((Application *)local_70,1.0);
    Image::draw((Image *)&triangle.rotationY);
    Triangle::draw((Triangle *)((long)&houseMesh + 4));
    Application::reshapeOrtho((Application *)local_70,fpsCounter.rotationX);
    snprintf(main::outputString,0x32,"frame time: %.2f ms  fps: %d",(double)frameTime,(ulong)fps);
    std::__cxx11::string::operator=((string *)&fpsCounter.scale,main::outputString);
    Text::draw((Text *)local_410);
    Application::swapBuffers((Application *)local_70);
  }
  cleanExit((Application *)local_70);
  Text::~Text((Text *)local_410);
  Texture::~Texture((Texture *)local_2d0);
  Texture::~Texture((Texture *)local_214);
  Texture::~Texture((Texture *)local_1ac);
  GamepadInputHandler::~GamepadInputHandler((GamepadInputHandler *)local_150);
  Application::~Application((Application *)local_70);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    DEBUG_PRINTLN("Application started!");
    int width = 640;
    int height = 480;
    Application app;
    app.createWindow("GLEX Graphics Example", width, height);

    // Basic gamepad handling
    GamepadState lastGamepad1State;
    GamepadInputHandler gamepad1(GamepadIndex::FIRST);
    gamepad1.registerRawStateCallback([&app, &lastGamepad1State](GamepadState gamepadState) {
        // Store last state
        lastGamepad1State = gamepadState;

        // Check for L + R + Start button combo to exit the app
        if (gamepadState.analog[GamepadAnalog::L_TRIGGER] > 0.9 && gamepadState.analog[GamepadAnalog::R_TRIGGER] > 0.9 && gamepadState.buttons[GamepadButton::START] == GamepadButtonState::PRESSED) {
            DEBUG_PRINTLN("L + R + Start pressed!");
            cleanExit(&app);
        }
    });
    app.addInputHandler(std::shared_ptr<GamepadInputHandler>(&gamepad1));

    // NOTE: Both Image and Mesh classes can use textures loaded from JPG, PNG, or BMP.
    //       All PNG files have been run through pngcrush.
    //
    //       I have not yet done profiling to determine the performance and memory 
    //       implications of using each file format. However keep in mind that only PNG
    //       fully supports RGBA as the others do not have alpha channels. The below test
    //       code demostrates loading all 3 types. You can also change the extensions to 
    //       try the other formats yourself for testing/profiling. 
    //
    //       In my limited testing with dcload only, the file size seems to have a much larger
    //       impact on loading time than the format. So I found JPG files load significantly
    //       faster than either PNG or BMP with no noticeable loss in quality (though no alpha).

    Texture grayBrickTexture;
    grayBrickTexture.loadRGB("images/gray_brick_512.jpg");
    Image grayBrickImage(&grayBrickTexture, 0, (float)app.windowHeight(), Image::Z_BACKGROUND, (float)app.windowWidth(), (float)app.windowHeight(), app.screenScale);

    Texture woodTexture;
    woodTexture.loadRGB("images/wood1.bmp");
    Image woodImage(&woodTexture, 250, 420, 10, Image::Z_HUD, 100, app.screenScale);

    Triangle triangle(250, 220, 10, Image::Z_HUD, 100, app.screenScale);

    MeshData *houseMesh = MeshLoader::loadObjMesh("meshes/house.obj");
    Texture houseTexture;
    houseTexture.loadRGBA("images/house_512.png");
    Mesh mesh(houseMesh, &houseTexture, 0.3f);

    Cube cube;

    FontColor darkBlue{21, 1, 148};
    FontFace fontFace = app.screenScale > 1.0 ? FontFace::arial_28 : FontFace::arial_16;
    Text fpsCounter(fontFace, "", darkBlue, 20, 20, Image::Z_HUD, app.screenScale);
    fpsCounter.createTexture();

#ifdef DREAMCAST
    // Init perf counter
    PMCR_Init(PERF_COUNTER_WHICH, PMCR_ELAPSED_TIME_MODE, PMCR_COUNT_CPU_CYCLES);
    lastTimeMs = PMCR_Read(PERF_COUNTER_WHICH) / PERF_COUNTER_NS_TO_MS;
#endif

    DEBUG_PRINTLN("\n\nPress L + R + Start to exit...");

    // Main loop
    while (!app.windowShouldClose()) {
        // Measure speed
        nbFrames++;

#ifdef DREAMCAST
        currentTimeMs = PMCR_Read(PERF_COUNTER_WHICH) / PERF_COUNTER_NS_TO_MS;
        timeDiff = currentTimeMs - lastTimeMs;
        if (timeDiff >= 1000) {
            frameTime = float(timeDiff) / float(nbFrames);
            fps = nbFrames;
            nbFrames = 0;
            lastTimeMs = currentTimeMs;
        }
#else
        currentTime = std::chrono::high_resolution_clock::now();
        timeDiff = (uint16_t)std::chrono::duration_cast<std::chrono::milliseconds>(currentTime - lastTime).count();
        if (timeDiff >= 1000) {
            frameTime = float(timeDiff) / float(nbFrames);
            fps = nbFrames;
            nbFrames = 0;
            lastTime = currentTime;
        }
#endif

        // Handle input
        app.handleInput();

        // Clear the buffer to draw the prepare frame
        app.clear();

        // Draw the background image
        app.reshapeOrtho(1.0);        
        grayBrickImage.draw();

        // Draw the 3d rotating house
        app.reshapeFrustum();
        mesh.draw();
        mesh.rotationX += 0.75;
        mesh.rotationY += 0.75;
        mesh.rotationZ += 0.75;
        // cube.draw();

        // Draw the foreground 2d image
        app.reshapeOrtho(1.0);
        woodImage.draw();
        triangle.draw();

        // Draw the FPS counter HUD text
        app.reshapeOrtho(fpsCounter.scale);
        static char outputString[50];
        snprintf(&outputString[0], 50, "frame time: %.2f ms  fps: %d", frameTime, fps);
        fpsCounter.text = outputString;
        fpsCounter.draw();

        // Swap buffers to display the current frame
        app.swapBuffers();
    }

    cleanExit(&app);
}